

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O0

void __thiscall cube::net::TcpConnection::CloseAfter(TcpConnection *this,int64_t delay_ms)

{
  EventLoop *this_00;
  enable_shared_from_this<cube::net::TcpConnection> local_78;
  code *local_68;
  undefined8 local_60;
  type local_58;
  Task local_38;
  int64_t local_18;
  int64_t delay_ms_local;
  TcpConnection *this_local;
  
  local_18 = delay_ms;
  delay_ms_local = (int64_t)this;
  EventLoop::AssertInLoopThread(this->m_event_loop);
  this_00 = this->m_event_loop;
  local_68 = Close;
  local_60 = 0;
  std::enable_shared_from_this<cube::net::TcpConnection>::shared_from_this(&local_78);
  std::bind<void(cube::net::TcpConnection::*)(),std::shared_ptr<cube::net::TcpConnection>>
            (&local_58,(offset_in_TcpConnection_to_subr *)&local_68,
             (shared_ptr<cube::net::TcpConnection> *)&local_78);
  std::function<void()>::
  function<std::_Bind<void(cube::net::TcpConnection::*(std::shared_ptr<cube::net::TcpConnection>))()>,void>
            ((function<void()> *)&local_38,&local_58);
  EventLoop::RunAfter(this_00,&local_38,local_18);
  std::function<void_()>::~function(&local_38);
  std::_Bind<void_(cube::net::TcpConnection::*(std::shared_ptr<cube::net::TcpConnection>))()>::
  ~_Bind(&local_58);
  std::shared_ptr<cube::net::TcpConnection>::~shared_ptr
            ((shared_ptr<cube::net::TcpConnection> *)&local_78);
  return;
}

Assistant:

void TcpConnection::CloseAfter(int64_t delay_ms) {
    m_event_loop->AssertInLoopThread();
    m_event_loop->RunAfter(std::bind(&TcpConnection::Close, shared_from_this()), delay_ms);
}